

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
* __thiscall
duckdb::ClientContext::ParseStatementsInternal
          (vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
           *__return_storage_ptr__,ClientContext *this,ClientContextLock *lock,string *query)

{
  ParserOptions options_p;
  DatabaseInstance *pDVar1;
  PragmaHandler handler;
  ParserOptions options;
  Parser parser;
  PragmaHandler local_78;
  undefined1 local_70;
  undefined1 uStack_6f;
  undefined6 uStack_6e;
  idx_t iStack_68;
  vector<duckdb::ParserExtension,_true> *local_60;
  Parser local_58;
  
  local_70 = (this->config).preserve_identifier_case;
  uStack_6f = (this->config).integer_division;
  iStack_68 = (this->config).max_expression_depth;
  pDVar1 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->db);
  local_60 = &(pDVar1->config).parser_extensions;
  options_p.integer_division = (bool)uStack_6f;
  options_p.preserve_identifier_case = (bool)local_70;
  options_p._2_6_ = uStack_6e;
  options_p.max_expression_depth = iStack_68;
  options_p.extensions = local_60;
  Parser::Parser(&local_58,options_p);
  Parser::ParseQuery(&local_58,query);
  PragmaHandler::PragmaHandler(&local_78,this);
  PragmaHandler::HandlePragmaStatements(&local_78,lock,&local_58.statements);
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.statements.
       super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.statements.
       super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.statements.
       super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.statements.
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.statements.
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.statements.
  super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
             *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

vector<unique_ptr<SQLStatement>> ClientContext::ParseStatementsInternal(ClientContextLock &lock, const string &query) {
	Parser parser(GetParserOptions());
	parser.ParseQuery(query);

	PragmaHandler handler(*this);
	handler.HandlePragmaStatements(lock, parser.statements);

	return std::move(parser.statements);
}